

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Belief.cpp
# Opt level: O0

void __thiscall Belief::Belief(Belief *this,vector<double,_std::allocator<double>_> *belief)

{
  StateDistributionVector *in_RDI;
  StateDistributionVector *this_00;
  
  BeliefInterface::BeliefInterface((BeliefInterface *)in_RDI);
  (in_RDI->super_StateDistribution)._vptr_StateDistribution = (_func_int **)&PTR__Belief_00d30bd0;
  (in_RDI->super_StateDistribution)._vptr_StateDistribution = (_func_int **)&PTR__Belief_00d30bd0;
  this_00 = (StateDistributionVector *)&in_RDI->super_SDV;
  StateDistributionVector::StateDistributionVector(in_RDI);
  StateDistributionVector::operator=(this_00,(SDV *)in_RDI);
  return;
}

Assistant:

Belief::Belief(const vector<double> &belief)
{
    _m_b=belief;
#if Belief_CheckAndAbort
    if(!SanityCheck())
        abort();
#endif
}